

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O3

void __thiscall enact::Lexer::Lexer(Lexer *this,string *source)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  long lVar5;
  long *plVar6;
  undefined1 local_50b;
  undefined1 local_50a;
  undefined1 local_509;
  undefined1 *local_508 [2];
  undefined1 local_4f8 [16];
  undefined4 local_4e8;
  undefined1 *local_4e0 [2];
  undefined1 local_4d0 [16];
  undefined4 local_4c0;
  undefined1 *local_4b8 [2];
  undefined1 local_4a8 [16];
  undefined4 local_498;
  undefined1 *local_490 [2];
  undefined1 local_480 [16];
  undefined4 local_470;
  undefined1 *local_468 [2];
  undefined1 local_458 [16];
  undefined4 local_448;
  undefined1 *local_440 [2];
  undefined1 local_430 [16];
  undefined4 local_420;
  undefined1 *local_418 [2];
  undefined1 local_408 [16];
  undefined4 local_3f8;
  undefined1 *local_3f0 [2];
  undefined1 local_3e0 [16];
  undefined4 local_3d0;
  undefined1 *local_3c8 [2];
  undefined1 local_3b8 [16];
  undefined4 local_3a8;
  undefined1 *local_3a0 [2];
  undefined1 local_390 [16];
  undefined4 local_380;
  undefined1 *local_378 [2];
  undefined1 local_368 [16];
  undefined4 local_358;
  undefined1 *local_350 [2];
  undefined1 local_340 [16];
  undefined4 local_330;
  undefined1 *local_328 [2];
  undefined1 local_318 [16];
  undefined4 local_308;
  undefined1 *local_300 [2];
  undefined1 local_2f0 [16];
  undefined4 local_2e0;
  undefined1 *local_2d8 [2];
  undefined1 local_2c8 [16];
  undefined4 local_2b8;
  undefined1 *local_2b0 [2];
  undefined1 local_2a0 [16];
  undefined4 local_290;
  undefined1 *local_288 [2];
  undefined1 local_278 [16];
  undefined4 local_268;
  undefined1 *local_260 [2];
  undefined1 local_250 [16];
  undefined4 local_240;
  undefined1 *local_238 [2];
  undefined1 local_228 [16];
  undefined4 local_218;
  undefined1 *local_210 [2];
  undefined1 local_200 [16];
  undefined4 local_1f0;
  undefined1 *local_1e8 [2];
  undefined1 local_1d8 [16];
  undefined4 local_1c8;
  undefined1 *local_1c0 [2];
  undefined1 local_1b0 [16];
  undefined4 local_1a0;
  undefined1 *local_198 [2];
  undefined1 local_188 [16];
  undefined4 local_178;
  undefined1 *local_170 [2];
  undefined1 local_160 [16];
  undefined4 local_150;
  undefined1 *local_148 [2];
  undefined1 local_138 [16];
  undefined4 local_128;
  undefined1 *local_120 [2];
  undefined1 local_110 [16];
  undefined4 local_100;
  undefined1 *local_f8 [2];
  undefined1 local_e8 [16];
  undefined4 local_d8;
  undefined1 *local_d0 [2];
  undefined1 local_c0 [16];
  undefined4 local_b0;
  undefined1 *local_a8 [2];
  undefined1 local_98 [16];
  undefined4 local_88;
  undefined1 *local_80 [2];
  undefined1 local_70 [16];
  undefined4 local_60;
  long *local_58 [2];
  long local_48 [2];
  undefined4 local_38;
  
  paVar1 = &(this->m_source).field_2;
  (this->m_source)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (source->_M_dataplus)._M_p;
  paVar2 = &source->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&source->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->m_source).field_2 + 8) = uVar4;
  }
  else {
    (this->m_source)._M_dataplus._M_p = pcVar3;
    (this->m_source).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->m_source)._M_string_length = source->_M_string_length;
  (source->_M_dataplus)._M_p = (pointer)paVar2;
  source->_M_string_length = 0;
  (source->field_2)._M_local_buf[0] = '\0';
  this->m_current = 0;
  this->m_line = 1;
  this->m_col = 0;
  (this->m_last).lexeme._M_dataplus._M_p = (pointer)&(this->m_last).lexeme.field_2;
  (this->m_last).lexeme._M_string_length = 0;
  (this->m_last).lexeme.field_2._M_local_buf[0] = '\0';
  this->m_currentInterpolations = 0;
  local_508[0] = local_4f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_508,"and","");
  local_4e8 = 0x27;
  local_4e0[0] = local_4d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4e0,"as","");
  local_4c0 = 0x28;
  local_4b8[0] = local_4a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4b8,"assoc","");
  local_498 = 0x29;
  local_490[0] = local_480;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_490,"break","");
  local_470 = 0x2a;
  local_468[0] = local_458;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_468,"case","");
  local_448 = 0x2b;
  local_440[0] = local_430;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_440,"continue","");
  local_420 = 0x2c;
  local_418[0] = local_408;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"default","");
  local_3f8 = 0x2d;
  local_3f0[0] = local_3e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3f0,"else","");
  local_3d0 = 0x2e;
  local_3c8[0] = local_3b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3c8,"enum","");
  local_3a8 = 0x2f;
  local_3a0[0] = local_390;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3a0,"false","");
  local_380 = 0x30;
  local_378[0] = local_368;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_378,"func","");
  local_358 = 0x32;
  local_350[0] = local_340;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_350,"for","");
  local_330 = 0x33;
  local_328[0] = local_318;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_328,"gc","");
  local_308 = 0x31;
  local_300[0] = local_2f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_300,"if","");
  local_2e0 = 0x34;
  local_2d8[0] = local_2c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2d8,"imm","");
  local_2b8 = 0x35;
  local_2b0[0] = local_2a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"impl","");
  local_290 = 0x36;
  local_288[0] = local_278;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_288,"in","");
  local_268 = 0x37;
  local_260[0] = local_250;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_260,"is","");
  local_240 = 0x38;
  local_238[0] = local_228;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"mut","");
  local_218 = 0x39;
  local_210[0] = local_200;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_210,"not","");
  local_1f0 = 0x3a;
  local_1e8[0] = local_1d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"or","");
  local_1c8 = 0x3b;
  local_1c0[0] = local_1b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c0,"pub","");
  local_1a0 = 0x3c;
  local_198[0] = local_188;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"rc","");
  local_178 = 0x3d;
  local_170[0] = local_160;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"return","");
  local_150 = 0x3e;
  local_148[0] = local_138;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"so","");
  local_128 = 0x3f;
  local_120[0] = local_110;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"struct","");
  local_100 = 0x40;
  local_f8[0] = local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"switch","");
  local_d8 = 0x41;
  local_d0[0] = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"trait","");
  local_b0 = 0x42;
  local_a8[0] = local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"true","");
  local_88 = 0x43;
  local_80[0] = local_70;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"when","");
  local_60 = 0x44;
  plVar6 = local_48;
  local_58[0] = plVar6;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"while","");
  local_38 = 0x45;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,enact::TokenType>,std::allocator<std::pair<std::__cxx11::string_const,enact::TokenType>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_Hashtable<std::pair<std::__cxx11::string_const,enact::TokenType>const*>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,enact::TokenType>,std::allocator<std::pair<std::__cxx11::string_const,enact::TokenType>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)&this->m_keywords,local_508,&stack0xffffffffffffffd0,0,&local_509,&local_50a,
             &local_50b);
  lVar5 = -0x4d8;
  do {
    if (plVar6 != (long *)plVar6[-2]) {
      operator_delete((long *)plVar6[-2],*plVar6 + 1);
    }
    plVar6 = plVar6 + -5;
    lVar5 = lVar5 + 0x28;
  } while (lVar5 != 0);
  return;
}

Assistant:

Lexer::Lexer(std::string source) : m_source{std::move(source)} {}